

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RuleBasedBreakIterator::handleSafePrevious
          (RuleBasedBreakIterator *this,int32_t fromPosition)

{
  UText *ut;
  ushort uVar1;
  RBBIStateTable *pRVar2;
  UChar *pUVar3;
  UTrie2 *pUVar4;
  uint16_t *puVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int64_t iVar9;
  uint uVar10;
  ulong uVar11;
  
  pRVar2 = this->fData->fReverseTable;
  ut = &this->fText;
  lVar8 = (long)fromPosition - (this->fText).chunkNativeStart;
  if (((lVar8 < 0) || ((this->fText).nativeIndexingLimit <= lVar8)) ||
     (0xdbff < (ushort)(this->fText).chunkContents[lVar8])) {
    utext_setNativeIndex_63(ut,(long)fromPosition);
    if (this->fData == (RBBIDataWrapper *)0x0) {
      return -1;
    }
  }
  else {
    (this->fText).chunkOffset = (int32_t)lVar8;
  }
  iVar7 = (this->fText).chunkOffset;
  if ((this->fText).nativeIndexingLimit < iVar7) {
    lVar8 = (*((this->fText).pFuncs)->mapOffsetToNative)(ut);
  }
  else {
    lVar8 = (long)iVar7 + (this->fText).chunkNativeStart;
  }
  if (lVar8 == 0) {
    return -1;
  }
  iVar7 = (this->fText).chunkOffset;
  if (((long)iVar7 < 1) ||
     (pUVar3 = (this->fText).chunkContents, 0xd7ff < (ushort)pUVar3[(long)iVar7 + -1])) {
    uVar6 = utext_previous32_63(ut);
    if (uVar6 == 0xffffffff) goto LAB_0029d0cc;
  }
  else {
    (this->fText).chunkOffset = iVar7 - 1U;
    uVar6 = (uint)(ushort)pUVar3[iVar7 - 1U];
  }
  uVar10 = pRVar2->fRowLen;
  do {
    pUVar4 = this->fData->fTrie;
    puVar5 = pUVar4->index;
    if (uVar6 < 0xd800) {
      uVar1 = puVar5[uVar6 >> 5];
LAB_0029d034:
      iVar7 = (uVar6 & 0x1f) + (uint)uVar1 * 4;
    }
    else {
      if (uVar6 < 0x10000) {
        uVar11 = (ulong)((uVar6 >> 5) + 0x140);
        if (0xdbff < uVar6) {
          uVar11 = (ulong)(uVar6 >> 5);
        }
LAB_0029d030:
        uVar1 = puVar5[uVar11];
        goto LAB_0029d034;
      }
      if (uVar6 < 0x110000) {
        if ((int)uVar6 < pUVar4->highStart) {
          uVar11 = (ulong)((uVar6 >> 5 & 0x3f) + (uint)puVar5[(ulong)(uVar6 >> 0xb) + 0x820]);
          goto LAB_0029d030;
        }
        iVar7 = pUVar4->highValueIndex;
      }
      else {
        iVar7 = pUVar4->indexLength + 0x80;
      }
    }
    if (*(ushort *)
         (pRVar2[1].fTableData + (ulong)(puVar5[iVar7] & 0xbfff) * 2 + (ulong)uVar10 + -0xc) == 0)
    break;
    uVar10 = (uint)*(ushort *)
                    (pRVar2[1].fTableData +
                    (ulong)(puVar5[iVar7] & 0xbfff) * 2 + (ulong)uVar10 + -0xc) * pRVar2->fRowLen;
    iVar7 = (this->fText).chunkOffset;
    if (((long)iVar7 < 1) ||
       (pUVar3 = (this->fText).chunkContents, 0xd7ff < (ushort)pUVar3[(long)iVar7 + -1])) {
      uVar6 = utext_previous32_63(ut);
    }
    else {
      (this->fText).chunkOffset = iVar7 - 1U;
      uVar6 = (uint)(ushort)pUVar3[iVar7 - 1U];
    }
  } while (uVar6 != 0xffffffff);
LAB_0029d0cc:
  iVar7 = (this->fText).chunkOffset;
  if (iVar7 <= (this->fText).nativeIndexingLimit) {
    return iVar7 + (int)(this->fText).chunkNativeStart;
  }
  iVar9 = (*((this->fText).pFuncs)->mapOffsetToNative)(ut);
  return (int32_t)iVar9;
}

Assistant:

int32_t RuleBasedBreakIterator::handleSafePrevious(int32_t fromPosition) {
    int32_t             state;
    uint16_t            category        = 0;
    RBBIStateTableRow  *row;
    UChar32             c;
    int32_t             result          = 0;

    const RBBIStateTable *stateTable = fData->fReverseTable;
    UTEXT_SETNATIVEINDEX(&fText, fromPosition);
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPuts("Handle Previous   pos   char  state category");
        }
    #endif

    // if we're already at the start of the text, return DONE.
    if (fData == NULL || UTEXT_GETNATIVEINDEX(&fText)==0) {
        return BreakIterator::DONE;
    }

    //  Set the initial state for the state machine
    c = UTEXT_PREVIOUS32(&fText);
    state = START_STATE;
    row = (RBBIStateTableRow *)
            (stateTable->fTableData + (stateTable->fRowLen * state));

    // loop until we reach the start of the text or transition to state 0
    //
    for (; c != U_SENTINEL; c = UTEXT_PREVIOUS32(&fText)) {

        // look up the current character's character category, which tells us
        // which column in the state table to look at.
        // Note:  the 16 in UTRIE_GET16 refers to the size of the data being returned,
        //        not the size of the character going in, which is a UChar32.
        //
        //  And off the dictionary flag bit. For reverse iteration it is not used.
        category = UTRIE2_GET16(fData->fTrie, c);
        category &= ~0x4000;

        #ifdef RBBI_DEBUG
            if (gTrace) {
                RBBIDebugPrintf("             %4d   ", (int32_t)utext_getNativeIndex(&fText));
                if (0x20<=c && c<0x7f) {
                    RBBIDebugPrintf("\"%c\"  ", c);
                } else {
                    RBBIDebugPrintf("%5x  ", c);
                }
                RBBIDebugPrintf("%3d  %3d\n", state, category);
            }
        #endif

        // State Transition - move machine to its next state
        //
        // fNextState is a variable-length array.
        U_ASSERT(category<fData->fHeader->fCatCount);
        state = row->fNextState[category];  /*Not accessing beyond memory*/
        row = (RBBIStateTableRow *)
            (stateTable->fTableData + (stateTable->fRowLen * state));

        if (state == STOP_STATE) {
            // This is the normal exit from the lookup state machine.
            // Transistion to state zero means we have found a safe point.
            break;
        }
    }

    // The state machine is done.  Check whether it found a match...
    result = (int32_t)UTEXT_GETNATIVEINDEX(&fText);
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPrintf("result = %d\n\n", result);
        }
    #endif
    return result;
}